

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

void __thiscall ImFontGlyphRangesBuilder::AddRanges(ImFontGlyphRangesBuilder *this,ImWchar *ranges)

{
  uint *puVar1;
  ushort uVar2;
  uint uVar3;
  bool bVar4;
  
  uVar2 = *ranges;
  do {
    if (uVar2 == 0) {
      return;
    }
    if (uVar2 <= ranges[1]) {
      uVar3 = (uint)uVar2;
      do {
        puVar1 = (uint *)(*(long *)(this + 8) + (ulong)(uVar3 >> 5) * 4);
        *puVar1 = *puVar1 | 1 << ((byte)uVar3 & 0x1f);
        if (0xfffe < uVar3) break;
        bVar4 = uVar3 < ranges[1];
        uVar3 = uVar3 + 1;
      } while (bVar4);
    }
    uVar2 = ranges[2];
    ranges = ranges + 2;
  } while( true );
}

Assistant:

void ImFontGlyphRangesBuilder::AddRanges(const ImWchar* ranges)
{
    for (; ranges[0]; ranges += 2)
        for (unsigned int c = ranges[0]; c <= ranges[1] && c <= IM_UNICODE_CODEPOINT_MAX; c++) //-V560
            AddChar((ImWchar)c);
}